

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void dumpFunction(DumpState *D,Proto *f)

{
  TString *local_28;
  Proto *f_local;
  DumpState *D_local;
  
  dumpInt(D,f->linedefined);
  dumpInt(D,f->lastlinedefined);
  dumpByte(D,(uint)f->numparams);
  dumpByte(D,(uint)f->flag);
  dumpByte(D,(uint)f->maxstacksize);
  dumpCode(D,f);
  dumpConstants(D,f);
  dumpUpvalues(D,f);
  dumpProtos(D,f);
  if (D->strip == 0) {
    local_28 = f->source;
  }
  else {
    local_28 = (TString *)0x0;
  }
  dumpString(D,local_28);
  dumpDebug(D,f);
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f) {
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->flag);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpString(D, D->strip ? NULL : f->source);
  dumpDebug(D, f);
}